

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O0

pair<const_int_*,_const_int_*> __thiscall
frozen::unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  const_iterator local_30;
  const_iterator it;
  int *key_local;
  unordered_set<int,_1UL,_frozen::elsa<int>,_std::equal_to<int>_> *this_local;
  
  it = key;
  key_local = (int *)this;
  pvVar1 = find<int>(this,key);
  local_30 = pvVar1;
  pvVar2 = end(this);
  if (pvVar1 == pvVar2) {
    local_40 = bits::carray<int,_1UL>::end(&this->keys_);
    local_48 = bits::carray<int,_1UL>::end(&this->keys_);
    std::pair<const_int_*,_const_int_*>::pair<const_int_*,_const_int_*,_true>
              ((pair<const_int_*,_const_int_*> *)&this_local,&local_40,&local_48);
  }
  else {
    local_38 = local_30 + 1;
    std::pair<const_int_*,_const_int_*>::pair<const_int_*,_true>
              ((pair<const_int_*,_const_int_*> *)&this_local,&local_30,&local_38);
  }
  return _this_local;
}

Assistant:

constexpr std::pair<const_iterator, const_iterator> equal_range(KeyType const &key) const {
    auto const it = find(key);
    if (it != end())
      return {it, it + 1};
    else
      return {keys_.end(), keys_.end()};
  }